

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
str_writer<char>::operator()
          (str_writer<char> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_type *local_20;
  char *pcStack_18;
  
  internal::copy_str<char,char_const*,std::ostream_iterator<char,char,std::char_traits<char>>>
            ((char *)&local_20,*(char **)this,
             (ostream_iterator<char,_char,_std::char_traits<char>_> *)
             (*(char **)this + *(long *)(this + 8)));
  it->_M_stream = local_20;
  it->_M_string = pcStack_18;
  return;
}

Assistant:

void operator()(It &&it) const {
      it = internal::copy_str<char_type>(s, s + size_, it);
    }